

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Buffers::MapRangeReadBitTest::CompareWithReference
          (MapRangeReadBitTest *this,GLuint *data,GLintptr offset,GLsizei length)

{
  TestContext *pTVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  MessageBuilder local_348;
  uint local_1c8;
  uint local_1c4;
  GLuint i;
  GLuint end;
  GLuint start;
  MessageBuilder local_1b0;
  GLsizei local_2c;
  GLintptr GStack_28;
  GLsizei length_local;
  GLintptr offset_local;
  GLuint *data_local;
  MapRangeReadBitTest *this_local;
  
  local_2c = length;
  GStack_28 = offset;
  offset_local = (GLintptr)data;
  data_local = (GLuint *)this;
  if (data == (GLuint *)0x0) {
    pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    pTVar2 = tcu::TestContext::getLog(pTVar1);
    tcu::TestLog::operator<<(&local_1b0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [42])"glMapNamedBufferRange called with offset ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffd8);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" and length ");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [56])0x2a75960);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
  }
  else {
    local_1c4 = (uint)((ulong)(offset + length) >> 2);
    i = (GLuint)((ulong)offset >> 2);
    for (local_1c8 = i; local_1c8 < local_1c4; local_1c8 = local_1c8 + 1) {
      if (data[local_1c8 - i] != *(GLuint *)(s_reference + (ulong)local_1c8 * 4)) {
        pTVar1 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar2 = tcu::TestContext::getLog(pTVar1);
        tcu::TestLog::operator<<(&local_348,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar3 = tcu::MessageBuilder::operator<<
                           (&local_348,(char (*) [42])"glMapNamedBufferRange called with offset ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffd8);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [13])" and length ");
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_2c);
        pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [68])0x2a759a8);
        tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_348);
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool MapRangeReadBitTest::CompareWithReference(glw::GLuint* data, glw::GLintptr offset, glw::GLsizei length)
{
	if (DE_NULL == data)
	{
		/* Log. */
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
			<< length << " returned NULL pointer, but buffer's data was expected." << tcu::TestLog::EndMessage;
	}
	else
	{
		glw::GLuint start = static_cast<glw::GLuint>((offset) / sizeof(s_reference[0]));
		glw::GLuint end   = static_cast<glw::GLuint>((offset + length) / sizeof(s_reference[0]));

		/* Comparison results with reference data. */
		for (glw::GLuint i = start; i < end; ++i)
		{
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Warray-bounds"
#endif
			if (data[i - start] != s_reference[i])
			{
				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "glMapNamedBufferRange called with offset " << offset << " and length "
					<< length << " returned pointer to data which is not identical to reference data."
					<< tcu::TestLog::EndMessage;

				return false;
			}
#if (DE_COMPILER == DE_COMPILER_GCC)
#pragma GCC diagnostic pop
#endif
		}
	}

	return true;
}